

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
 __thiscall
bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
          (Parser<biosoup::Sequence> *this,string *path)

{
  gzFile file;
  FastaParser<biosoup::Sequence> *this_00;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  file = (gzFile)gzopen((path->_M_dataplus)._M_p,"r");
  if (file != (gzFile)0x0) {
    this_00 = (FastaParser<biosoup::Sequence> *)operator_new(0x58);
    FastaParser<biosoup::Sequence>::FastaParser(this_00,file);
    this->_vptr_Parser = (_func_int **)this_00;
    return (__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
            )(__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
              )this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"[bioparser::Parser::Create] error: unable to open file ",path);
  std::invalid_argument::invalid_argument(this_01,(string *)&bStack_48);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static std::unique_ptr<Parser<T>> Create(const std::string& path) {
    auto file = gzopen(path.c_str(), "r");
    if (file == nullptr) {
      throw std::invalid_argument(
          "[bioparser::Parser::Create] error: unable to open file " + path);
    }
    return std::unique_ptr<Parser<T>>(new P<T>(file));
  }